

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O2

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
Chi2Test_abi_cxx11_(pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *__return_storage_ptr__,Float *frequencies,Float *expFrequencies,int thetaRes,
                   int phiRes,int sampleCount,Float minExpFrequency,Float significanceLevel,
                   int numTests)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  float fVar3;
  size_type sVar4;
  size_t sVar5;
  ulong uVar6;
  size_t *args;
  size_t sVar7;
  __normal_iterator<Cell_*,_std::vector<Cell,_std::allocator<Cell>_>_> __i;
  long lVar8;
  pointer pCVar9;
  int iVar10;
  undefined4 in_register_00000084;
  pointer pCVar11;
  pointer pCVar12;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar13;
  float fVar14;
  double dVar15;
  float fVar16;
  float fVar17;
  allocator<char> local_89;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  string result;
  Float alpha;
  Float pval;
  int local_4c;
  undefined1 local_48 [16];
  pointer local_38;
  
  iVar10 = thetaRes * phiRes;
  if (iVar10 < 0) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  local_38 = (pointer)0x0;
  local_48._0_12_ = ZEXT812(0);
  local_48._12_4_ = 0;
  lVar8 = (long)iVar10;
  local_88 = __return_storage_ptr__;
  if (iVar10 == 0) {
    local_38 = (pointer)(lVar8 << 4);
    pCVar12 = (pointer)0x0;
    local_48._0_8_ = (pointer)0x0;
  }
  else {
    local_48._0_8_ = operator_new(lVar8 * 0x10);
    local_38 = (pointer)(local_48._0_8_ + lVar8 * 0x10);
    *(undefined1 (*) [16])local_48._0_8_ = ZEXT816(0) << 0x40;
    if (iVar10 == 1) {
      pCVar12 = (pointer)(local_48._0_8_ + 0x10);
    }
    else {
      for (uVar6 = 0x10; pCVar12 = local_38, lVar8 * 0x10 != uVar6; uVar6 = uVar6 + 0x10) {
        *(Cell *)((long)&((pointer)local_48._0_8_)->expFrequency + uVar6) = *(Cell *)local_48._0_8_;
      }
    }
  }
  pCVar11 = (pointer)local_48._0_8_;
  lVar8 = (long)pCVar12 - local_48._0_8_;
  args = (size_t *)(local_48._0_8_ + 8);
  local_48._8_8_ = pCVar12;
  sVar5 = lVar8 >> 4;
  for (sVar7 = 0; sVar5 != sVar7; sVar7 = sVar7 + 1) {
    ((Cell *)(args + -1))->expFrequency = expFrequencies[sVar7];
    *args = sVar7;
    args = args + 2;
  }
  if ((pointer)local_48._0_8_ != pCVar12) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell*,std::vector<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell,std::allocator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::__0>>
              (local_48._0_8_,pCVar12,(int)LZCOUNT(sVar5) * 2 ^ 0x7e);
    if (lVar8 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell*,std::vector<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell,std::allocator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell>>>,__gnu_cxx::__ops::_Iter_comp_iter<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::__0>>
                (pCVar11,pCVar12);
    }
    else {
      pCVar9 = pCVar11 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell*,std::vector<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell,std::allocator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell>>>,__gnu_cxx::__ops::_Iter_comp_iter<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::__0>>
                (pCVar11,pCVar9);
      for (; pCVar9 != pCVar12; pCVar9 = pCVar9 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell*,std::vector<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell,std::allocator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell>>>,__gnu_cxx::__ops::_Val_comp_iter<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::__0>>
                  (pCVar9);
      }
    }
  }
  ppVar13 = local_88;
  fVar17 = 0.0;
  fVar16 = 0.0;
  iVar10 = 0;
  fVar14 = 0.0;
  do {
    if (pCVar11 == pCVar12) {
      if ((0.0 < fVar17) || (0.0 < fVar16)) {
        iVar10 = iVar10 + 1;
        fVar14 = fVar14 + ((fVar16 - fVar17) * (fVar16 - fVar17)) / fVar17;
      }
      local_4c = iVar10 + -1;
      if (iVar10 < 2) {
        pbrt::StringPrintf<int&>
                  (&result,(pbrt *)"The number of degrees of freedom %d is too low!",
                   (char *)&local_4c,(int *)args);
        ppVar13->first = false;
        std::__cxx11::string::string((string *)&ppVar13->second,(string *)&result);
      }
      else {
        dVar15 = Chi2CDF((double)fVar14,local_4c);
        fVar16 = 1.0 - (float)dVar15;
        pval = fVar16;
        fVar14 = powf(1.0 - significanceLevel,1.0 / (float)numTests);
        alpha = 1.0 - fVar14;
        if (alpha <= fVar16 && (uint)ABS(fVar16) < 0x7f800000) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&result,"",&local_89);
          sVar4 = result._M_string_length;
          paVar1 = &(ppVar13->second).field_2;
          ppVar13->first = true;
          (ppVar13->second)._M_dataplus._M_p = (pointer)paVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result._M_dataplus._M_p == &result.field_2) {
            paVar1->_M_allocated_capacity =
                 CONCAT71(result.field_2._M_allocated_capacity._1_7_,result.field_2._M_local_buf[0])
            ;
            *(undefined8 *)((long)&(ppVar13->second).field_2 + 8) = result.field_2._8_8_;
          }
          else {
            (ppVar13->second)._M_dataplus._M_p = result._M_dataplus._M_p;
            (ppVar13->second).field_2._M_allocated_capacity =
                 CONCAT71(result.field_2._M_allocated_capacity._1_7_,result.field_2._M_local_buf[0])
            ;
          }
          result._M_string_length = 0;
          result.field_2._M_local_buf[0] = '\0';
          (ppVar13->second)._M_string_length = sVar4;
          result._M_dataplus._M_p = (pointer)&result.field_2;
        }
        else {
          pbrt::StringPrintf<float&,float&>
                    (&result,(pbrt *)
                             "Rejected the null hypothesis (p-value = %f, significance level = %f",
                     (char *)&pval,&alpha,(float *)CONCAT44(in_register_00000084,phiRes));
          ppVar13->first = false;
          std::__cxx11::string::string((string *)&ppVar13->second,(string *)&result);
        }
      }
LAB_002fafce:
      std::__cxx11::string::~string((string *)&result);
      std::vector<Cell,_std::allocator<Cell>_>::~vector
                ((vector<Cell,_std::allocator<Cell>_> *)local_48);
      return ppVar13;
    }
    args = (size_t *)pCVar11->index;
    fVar2 = expFrequencies[(long)args];
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      if (minExpFrequency <= fVar2) {
        fVar3 = frequencies[(long)args];
        if ((fVar17 <= 0.0) || (minExpFrequency <= fVar17)) {
          iVar10 = iVar10 + 1;
          fVar14 = fVar14 + ((fVar3 - fVar2) * (fVar3 - fVar2)) / fVar2;
          goto LAB_002fae53;
        }
      }
      else {
        fVar3 = frequencies[(long)args];
      }
      fVar16 = fVar16 + fVar3;
      fVar17 = fVar17 + fVar2;
    }
    else if ((float)sampleCount * 1e-05 < frequencies[(long)args]) {
      pbrt::StringPrintf<float_const&>
                (&result,(pbrt *)
                         "Encountered %f samples in a c with expected frequency 0. Rejecting the null hypothesis!"
                 ,(char *)(frequencies + (long)args),(float *)args);
      ppVar13 = local_88;
      local_88->first = false;
      std::__cxx11::string::string((string *)&local_88->second,(string *)&result);
      goto LAB_002fafce;
    }
LAB_002fae53:
    pCVar11 = pCVar11 + 1;
  } while( true );
}

Assistant:

std::pair<bool, std::string> Chi2Test(const Float* frequencies,
                                      const Float* expFrequencies, int thetaRes,
                                      int phiRes, int sampleCount, Float minExpFrequency,
                                      Float significanceLevel, int numTests) {
    struct Cell {
        Float expFrequency;
        size_t index;
    };

    /* Sort all cells by their expected frequencies */
    std::vector<Cell> cells(thetaRes * phiRes);
    for (size_t i = 0; i < cells.size(); ++i) {
        cells[i].expFrequency = expFrequencies[i];
        cells[i].index = i;
    }
    std::sort(cells.begin(), cells.end(), [](const Cell& a, const Cell& b) {
        return a.expFrequency < b.expFrequency;
    });

    /* Compute the Chi^2 statistic and pool cells as necessary */
    Float pooledFrequencies = 0, pooledExpFrequencies = 0, chsq = 0;
    int pooledCells = 0, dof = 0;

    for (const Cell& c : cells) {
        if (expFrequencies[c.index] == 0) {
            if (frequencies[c.index] > sampleCount * 1e-5f) {
                /* Uh oh: samples in a c that should be completely empty
                   according to the probability density function. Ordinarily,
                   even a single sample requires immediate rejection of the null
                   hypothesis. But due to finite-precision computations and
                   rounding
                   errors, this can occasionally happen without there being an
                   actual bug. Therefore, the criterion here is a bit more
                   lenient. */

                std::string result =
                    StringPrintf("Encountered %f samples in a c with expected "
                                 "frequency 0. Rejecting the null hypothesis!",
                                 frequencies[c.index]);
                return std::make_pair(false, result);
            }
        } else if (expFrequencies[c.index] < minExpFrequency) {
            /* Pool cells with low expected frequencies */
            pooledFrequencies += frequencies[c.index];
            pooledExpFrequencies += expFrequencies[c.index];
            pooledCells++;
        } else if (pooledExpFrequencies > 0 && pooledExpFrequencies < minExpFrequency) {
            /* Keep on pooling cells until a sufficiently high
               expected frequency is achieved. */
            pooledFrequencies += frequencies[c.index];
            pooledExpFrequencies += expFrequencies[c.index];
            pooledCells++;
        } else {
            Float diff = frequencies[c.index] - expFrequencies[c.index];
            chsq += (diff * diff) / expFrequencies[c.index];
            ++dof;
        }
    }

    if (pooledExpFrequencies > 0 || pooledFrequencies > 0) {
        Float diff = pooledFrequencies - pooledExpFrequencies;
        chsq += (diff * diff) / pooledExpFrequencies;
        ++dof;
    }

    /* All parameters are assumed to be known, so there is no
       additional DF reduction due to model parameters */
    dof -= 1;

    if (dof <= 0) {
        std::string result =
            StringPrintf("The number of degrees of freedom %d is too low!", dof);
        return std::make_pair(false, result);
    }

    /* Probability of obtaining a test statistic at least
       as extreme as the one observed under the assumption
       that the distributions match */
    Float pval = 1 - (Float)Chi2CDF(chsq, dof);

    /* Apply the Sidak correction term, since we'll be conducting multiple
       independent
       hypothesis tests. This accounts for the fact that the probability of a
       failure
       increases quickly when several hypothesis tests are run in sequence. */
    Float alpha = 1.0f - std::pow(1.0f - significanceLevel, 1.0f / numTests);

    if (pval < alpha || !std::isfinite(pval)) {
        std::string result = StringPrintf("Rejected the null hypothesis (p-value = %f, "
                                          "significance level = %f",
                                          pval, alpha);
        return std::make_pair(false, result);
    } else {
        return std::make_pair(true, std::string(""));
    }
}